

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcodes_llvm_builtins.cpp
# Opt level: O0

bool dxil_spv::emit_binary_instruction(Impl *impl,BinaryOperator *instruction)

{
  Id IVar1;
  BinaryOperator *instruction_local;
  Impl *impl_local;
  
  IVar1 = emit_binary_instruction_impl<LLVMBC::BinaryOperator>(impl,instruction);
  return IVar1 != 0;
}

Assistant:

bool emit_binary_instruction(Converter::Impl &impl, const llvm::BinaryOperator *instruction)
{
	return emit_binary_instruction_impl(impl, instruction) != 0;
}